

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O0

lzma_ret lzma_block_decoder_init
                   (lzma_next_coder_conflict10 *next,lzma_allocator *allocator,lzma_block *block)

{
  uint uVar1;
  uint32_t uVar2;
  lzma_vli lVar3;
  lzma_coder_conflict11 *plVar4;
  lzma_vli local_30;
  lzma_block *block_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict10 *next_local;
  
  if ((code *)next->init != lzma_block_decoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_block_decoder_init;
  lVar3 = lzma_block_unpadded_size(block);
  if ((lVar3 == 0) ||
     ((0x7fffffffffffffff < block->uncompressed_size &&
      (block->uncompressed_size != 0xffffffffffffffff)))) {
    next_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    if (next->coder == (lzma_coder_conflict11 *)0x0) {
      plVar4 = (lzma_coder_conflict11 *)lzma_alloc(0xd8,allocator);
      next->coder = plVar4;
      if (next->coder == (lzma_coder_conflict11 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->code = block_decode;
      next->end = block_decoder_end;
      memcpy(&next->coder->next,&LZMA_NEXT_CODER_INIT,0x40);
    }
    next->coder->sequence = SEQ_CODE;
    next->coder->block = block;
    next->coder->compressed_size = 0;
    next->coder->uncompressed_size = 0;
    if (block->compressed_size == 0xffffffffffffffff) {
      uVar1 = block->header_size;
      uVar2 = lzma_check_size(block->check);
      local_30 = (0x7ffffffffffffffc - (ulong)uVar1) - (ulong)uVar2;
    }
    else {
      local_30 = block->compressed_size;
    }
    next->coder->compressed_limit = local_30;
    next->coder->check_pos = 0;
    lzma_check_init(&next->coder->check,block->check);
    next_local._4_4_ =
         lzma_raw_decoder_init((lzma_next_coder *)&next->coder->next,allocator,block->filters);
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_block_decoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		lzma_block *block)
{
	lzma_next_coder_init(&lzma_block_decoder_init, next, allocator);

	// Validate the options. lzma_block_unpadded_size() does that for us
	// except for Uncompressed Size and filters. Filters are validated
	// by the raw decoder.
	if (lzma_block_unpadded_size(block) == 0
			|| !lzma_vli_is_valid(block->uncompressed_size))
		return LZMA_PROG_ERROR;

	// Allocate and initialize *next->coder if needed.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &block_decode;
		next->end = &block_decoder_end;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	next->coder->sequence = SEQ_CODE;
	next->coder->block = block;
	next->coder->compressed_size = 0;
	next->coder->uncompressed_size = 0;

	// If Compressed Size is not known, we calculate the maximum allowed
	// value so that encoded size of the Block (including Block Padding)
	// is still a valid VLI and a multiple of four.
	next->coder->compressed_limit
			= block->compressed_size == LZMA_VLI_UNKNOWN
				? (LZMA_VLI_MAX & ~LZMA_VLI_C(3))
					- block->header_size
					- lzma_check_size(block->check)
				: block->compressed_size;

	// Initialize the check. It's caller's problem if the Check ID is not
	// supported, and the Block decoder cannot verify the Check field.
	// Caller can test lzma_check_is_supported(block->check).
	next->coder->check_pos = 0;
	lzma_check_init(&next->coder->check, block->check);

	// Initialize the filter chain.
	return lzma_raw_decoder_init(&next->coder->next, allocator,
			block->filters);
}